

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathIdFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlXPathObjectPtr pxVar1;
  xmlChar *ids;
  xmlNodeSetPtr pxVar2;
  xmlXPathObjectPtr value;
  int local_3c;
  int i;
  xmlNodeSetPtr ns;
  xmlXPathObjectPtr obj;
  xmlNodeSetPtr ret;
  xmlChar *tokens;
  int nargs_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < ctxt->valueFrame + 1) {
        xmlXPathErr(ctxt,0x17);
      }
      else {
        pxVar1 = valuePop(ctxt);
        if (pxVar1 == (xmlXPathObjectPtr)0x0) {
          xmlXPathErr(ctxt,10);
        }
        else if ((pxVar1->type == XPATH_NODESET) || (pxVar1->type == XPATH_XSLT_TREE)) {
          obj = (xmlXPathObjectPtr)xmlXPathNodeSetCreate((xmlNodePtr)0x0);
          if (pxVar1->nodesetval != (xmlNodeSetPtr)0x0) {
            for (local_3c = 0; local_3c < pxVar1->nodesetval->nodeNr; local_3c = local_3c + 1) {
              ids = xmlXPathCastNodeToString(pxVar1->nodesetval->nodeTab[local_3c]);
              pxVar2 = xmlXPathGetElementsByIds(ctxt->context->doc,ids);
              obj = (xmlXPathObjectPtr)xmlXPathNodeSetMerge((xmlNodeSetPtr)obj,pxVar2);
              xmlXPathFreeNodeSet(pxVar2);
              if (ids != (xmlChar *)0x0) {
                (*xmlFree)(ids);
              }
            }
          }
          xmlXPathReleaseObject(ctxt->context,pxVar1);
          pxVar1 = xmlXPathCacheWrapNodeSet(ctxt->context,(xmlNodeSetPtr)obj);
          valuePush(ctxt,pxVar1);
        }
        else {
          pxVar1 = xmlXPathCacheConvertString(ctxt->context,pxVar1);
          if (pxVar1 != (xmlXPathObjectPtr)0x0) {
            pxVar2 = xmlXPathGetElementsByIds(ctxt->context->doc,pxVar1->stringval);
            value = xmlXPathCacheWrapNodeSet(ctxt->context,pxVar2);
            valuePush(ctxt,value);
            xmlXPathReleaseObject(ctxt->context,pxVar1);
          }
        }
      }
    }
    else {
      xmlXPathErr(ctxt,0xc);
    }
  }
  return;
}

Assistant:

void
xmlXPathIdFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlChar *tokens;
    xmlNodeSetPtr ret;
    xmlXPathObjectPtr obj;

    CHECK_ARITY(1);
    obj = valuePop(ctxt);
    if (obj == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if ((obj->type == XPATH_NODESET) || (obj->type == XPATH_XSLT_TREE)) {
	xmlNodeSetPtr ns;
	int i;

        /* TODO: Check memory error. */
	ret = xmlXPathNodeSetCreate(NULL);

	if (obj->nodesetval != NULL) {
	    for (i = 0; i < obj->nodesetval->nodeNr; i++) {
		tokens =
		    xmlXPathCastNodeToString(obj->nodesetval->nodeTab[i]);
		ns = xmlXPathGetElementsByIds(ctxt->context->doc, tokens);
                /* TODO: Check memory error. */
		ret = xmlXPathNodeSetMerge(ret, ns);
		xmlXPathFreeNodeSet(ns);
		if (tokens != NULL)
		    xmlFree(tokens);
	    }
	}
	xmlXPathReleaseObject(ctxt->context, obj);
	valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
	return;
    }
    obj = xmlXPathCacheConvertString(ctxt->context, obj);
    if (obj == NULL) return;
    ret = xmlXPathGetElementsByIds(ctxt->context->doc, obj->stringval);
    valuePush(ctxt, xmlXPathCacheWrapNodeSet(ctxt->context, ret));
    xmlXPathReleaseObject(ctxt->context, obj);
    return;
}